

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O2

SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
* __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::operator=(SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *this,CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *_rhs)

{
  SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *pSVar1;
  type rhs;
  long local_18 [2];
  double local_8;
  
  local_18[0] = (_rhs->m_rows).m_value;
  local_8 = (_rhs->m_functor).m_other;
  pSVar1 = SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>,-1,1,true>,-1,1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>>>
           ::
           lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                     ((SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,_1,1,true>,_1,1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                       *)this,(DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)local_18);
  return pSVar1;
}

Assistant:

SelfCwiseBinaryOp& operator=(const Rhs& _rhs)
    {
      typename internal::nested<Rhs>::type rhs(_rhs);
      return Base::operator=(rhs);
    }